

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepEdgeArray::Write(ON_BrepEdgeArray *this,ON_BinaryArchive *file)

{
  int i;
  ON_BrepEdge *pOVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  bVar4 = false;
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (bVar2) {
    bVar3 = false;
    bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
    i = (this->super_ON_ObjectArray<ON_BrepEdge>).super_ON_ClassArray<ON_BrepEdge>.m_count;
    if (bVar2) {
      bVar3 = ON_BinaryArchive::WriteInt(file,i);
    }
    lVar5 = 0;
    for (lVar6 = 0; ((bVar3 & 1) != 0 && (lVar6 < i)); lVar6 = lVar6 + 1) {
      pOVar1 = (this->super_ON_ObjectArray<ON_BrepEdge>).super_ON_ClassArray<ON_BrepEdge>.m_a;
      bVar3 = (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                             (&(pOVar1->super_ON_CurveProxy).m_real_curve_domain +
                                             -2))->super_ON_Curve).super_ON_Geometry.super_ON_Object
                                            ._vptr_ON_Object + lVar5) + 0x50))
                        ((long)&(((ON_CurveProxy *)
                                 (&(pOVar1->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                         lVar5,file);
      lVar5 = lVar5 + 0x88;
    }
    bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar4 = (bool)(bVar3 & bVar4);
  }
  return bVar4;
}

Assistant:

bool ON_BrepEdgeArray::Write( ON_BinaryArchive& file ) const
{
  int i;
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) {
    rc = file.Write3dmChunkVersion(1,0);
    const int count = Count();
    if (rc) rc = file.WriteInt( count );
    for ( i = 0; rc && i < count; i++ ) {
      if (rc) rc = m_a[i].Write(file);
    }
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}